

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O3

void data_pipeline_3P_SPS(size_t L,uint w)

{
  U *pUVar1;
  element_type *peVar2;
  int *piVar3;
  _func_void *p_Var4;
  Topology *pTVar5;
  mutex *__mutex;
  _Head_base<0UL,_tf::Node_*,_false> _Var6;
  bool bVar7;
  char cVar8;
  void *pvVar9;
  void *__s;
  size_t *psVar10;
  ulong uVar11;
  long *plVar12;
  Node *pNVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  _func_int **pp_Var15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  value_type_conflict3 *__val;
  pointer *__ptr;
  char cVar19;
  _func_void *p_Var20;
  undefined8 uVar21;
  long lVar22;
  long in_FS_OFFSET;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  promise<void> promise;
  string __str;
  atomic<unsigned_long> j2;
  size_t j3;
  size_t j1;
  vector<int,_std::allocator<int>_> collection;
  size_t cnt;
  vector<int,_std::allocator<int>_> source;
  Task test;
  Task datapipeline;
  Taskflow taskflow;
  mutex mutex;
  Executor executor;
  future<void> local_478;
  undefined1 local_468 [16];
  undefined1 local_458 [18];
  undefined1 uStack_446;
  undefined1 uStack_445;
  undefined4 uStack_444;
  __basic_future<void> local_438;
  _Any_data local_428;
  _Manager_type local_418;
  _Invoker_type local_410;
  _Any_data local_408;
  undefined1 local_3f8 [16];
  long local_3e8;
  size_t local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  long local_3b8;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  local_3a8;
  undefined8 local_390;
  undefined4 local_388;
  ulong local_380;
  undefined1 *local_378;
  _Invoker_type *local_370;
  ulong local_368;
  undefined4 local_360;
  ulong local_358;
  _Manager_type *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  ulong local_338;
  int local_330;
  ulong local_328;
  undefined1 *local_320;
  _Any_data *local_318;
  ulong local_310;
  undefined8 local_308;
  undefined4 local_300;
  undefined1 local_2f8 [16];
  void *local_2e8;
  vector<tf::Task,_std::allocator<tf::Task>_> local_2e0;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_2c8;
  vector<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
  local_2b0;
  size_type local_298;
  ulong local_290;
  _Head_base<0UL,_tf::Node_*,_false> local_288;
  _Head_base<0UL,_tf::Node_*,_false> local_280;
  __shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2> local_278;
  undefined1 local_260 [80];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  _Map_pointer local_1b0;
  bool local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  Executor local_168;
  
  local_278._M_ptr = (element_type *)0x0;
  local_278._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,(ulong)w,(shared_ptr<tf::WorkerInterface> *)&local_278);
  if (local_278._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278._M_refcount._M_pi);
  }
  local_3c8 = (undefined1  [16])0x0;
  local_3b8 = 0;
  pvVar9 = operator_new(400);
  local_3c8._0_8_ = pvVar9;
  lVar22 = 0;
  local_3b8 = (long)pvVar9 + 400;
  memset(pvVar9,0,400);
  local_3c8._8_8_ = (long)pvVar9 + 400;
  iVar23 = 0;
  iVar24 = 1;
  iVar25 = 2;
  iVar26 = 3;
  do {
    piVar3 = (int *)((long)pvVar9 + lVar22 * 4);
    *piVar3 = iVar23;
    piVar3[1] = iVar24;
    piVar3[2] = iVar25;
    piVar3[3] = iVar26;
    lVar22 = lVar22 + 4;
    iVar23 = iVar23 + 4;
    iVar24 = iVar24 + 4;
    iVar25 = iVar25 + 4;
    iVar26 = iVar26 + 4;
  } while (lVar22 != 100);
  local_408._8_8_ = 0;
  local_290 = L * 0x18;
  local_298 = L + 1;
  pTVar5 = (Topology *)(local_458 + 0x10);
  local_3d8 = L;
  do {
    local_260._0_8_ = local_210;
    local_260._40_8_ = (__pthread_internal_list *)0x0;
    local_260._24_16_ = (undefined1  [16])0x0;
    local_260._8_16_ = (undefined1  [16])0x0;
    local_260._48_8_ = local_260 + 0x40;
    local_260._56_8_ = 0;
    local_260[0x40] = '\0';
    local_1b0 = (_Map_pointer)0x0;
    local_1c0 = (undefined1  [16])0x0;
    local_1d0 = (undefined1  [16])0x0;
    local_1e0 = (undefined1  [16])0x0;
    local_1f0 = (undefined1  [16])0x0;
    local_200 = (undefined1  [16])0x0;
    local_210 = (undefined1  [16])0x0;
    std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
    ::_M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                         *)(local_200 + 8),0);
    uVar11 = local_290;
    local_1a0 = false;
    local_408._M_unused._M_object = (void *)0x0;
    local_410 = (_Invoker_type)0x0;
    local_418 = (_Manager_type)0x0;
    local_178 = 0;
    local_188 = (undefined1  [16])0x0;
    local_198 = (undefined1  [16])0x0;
    local_3e8 = 0;
    local_3f8 = (undefined1  [16])0x0;
    local_3d0 = 1;
    local_3a8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388 = 2;
    local_380 = local_408._8_8_;
    local_378 = local_3c8;
    local_370 = &local_410;
    local_368 = local_3d8;
    local_360 = 1;
    local_358 = local_408._8_8_;
    local_350 = &local_418;
    local_348 = local_198;
    local_340 = local_3f8;
    local_338 = local_3d8;
    local_330 = 2;
    local_328 = local_408._8_8_;
    local_318 = &local_408;
    local_310 = local_3d8;
    local_308 = 0x100000002;
    local_300 = 2;
    local_320 = local_378;
    if (0x555555555555555 < local_3d8) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    local_2f8 = (undefined1  [16])0x0;
    local_2e8 = (void *)0x0;
    if (local_3d8 == 0) {
      local_2f8._0_8_ = 0;
      pvVar9 = (void *)0x0;
      local_2f8._8_8_ = 0;
    }
    else {
      __s = operator_new(local_290);
      local_2f8._0_8_ = __s;
      pvVar9 = (void *)((long)__s + local_3d8 * 0x18);
      memset(__s,0,uVar11);
      local_2f8._8_8_ = (long)__s + uVar11;
    }
    local_2e8 = pvVar9;
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_2e0,local_298,(allocator_type *)&local_478);
    sVar17 = local_3d8;
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_2c8,local_3d8,(allocator_type *)&local_478);
    std::
    vector<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
    ::vector(&local_2b0,sVar17,(allocator_type *)&local_478);
    if (sVar17 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                 ,0x180,(char (*) [28])"must have at least one line");
    }
    if (local_330 != 2) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                 ,0x184,(char (*) [26])"first pipe must be serial");
    }
    local_390 = 0;
    if ((long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar22 = ((long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      psVar10 = &(local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                  super__Vector_impl_data._M_start)->_pipe;
      sVar17 = 0;
      do {
        *psVar10 = 0;
        ((Pipeflow *)(psVar10 + -1))->_line = sVar17;
        sVar17 = sVar17 + 1;
        psVar10 = psVar10 + 0xc;
      } while (lVar22 + (ulong)(lVar22 == 0) != sVar17);
    }
    *(undefined8 *)local_2f8._0_8_ = 0;
    if (1 < (ulong)(((long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar11 = 1;
      lVar22 = 0x20;
      do {
        lVar18 = 0;
        do {
          *(long *)(local_2f8._0_8_ + lVar18 * 8 + lVar22) =
               (long)*(int *)((long)&local_308 + lVar18 * 4 + 4);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 2);
        uVar11 = uVar11 + 1;
        lVar22 = lVar22 + 0x18;
      } while (uVar11 < (ulong)(((long)local_2c8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2c8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    *(undefined8 *)(local_2f8._0_8_ + 8) = 1;
    *(undefined8 *)(local_2f8._0_8_ + 0x10) = 1;
    if (1 < (ulong)(((long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar11 = 1;
      lVar22 = 0x18;
      do {
        *(long *)(local_2f8._0_8_ + lVar22) = (long)(int)local_308 + -1;
        uVar11 = uVar11 + 1;
        lVar22 = lVar22 + 0x18;
      } while (uVar11 < (ulong)(((long)local_2c8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2c8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_478.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_478.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_478.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      **)&(((Node *)local_478.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                   *)&local_3a8;
    *(code **)((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x04';
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_3a8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_478);
    if ((Node *)local_478.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_478,
                 (Node *)local_478.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    pNVar13 = local_3a8.
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
              super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
              super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
    local_468._0_5_ = 0x646e6f63;
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_468;
    std::__cxx11::string::_M_assign((string *)&pNVar13->_name);
    (local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar13;
    if (local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_468) {
      operator_delete(local_478.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_468._0_8_ + 1);
    }
    if (local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2c8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar11 = 0;
      do {
        local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0xd8);
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_nstate = 0;
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_estate = (__atomic_base<int>)0x0;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name)._M_dataplus._M_p =
             (pointer)&(((Node *)local_478.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_name).field_2;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name)._M_string_length = 0;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
        pUVar1 = &(((Node *)local_478.super___basic_future<void>._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_data = (void *)0x0;
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_topology = (Topology *)0x0;
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_parent = (Node *)0x0;
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_num_successors = 0;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
             &((Node *)local_478.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_join_counter;
        (((Node *)local_478.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
        *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
          **)&(((Node *)local_478.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                       *)&local_3a8;
        *(ulong *)((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 8) = uVar11;
        *(code **)((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x18) =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
             ::_M_invoke;
        *(code **)((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x10) =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
             ::_M_manager;
        *(__index_type *)
         ((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x38) = '\x02';
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_semaphores =
             (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
              )0x0;
        ((Node *)local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_exception_ptr = (void *)0x0;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)&local_3a8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_478)
        ;
        if ((Node *)local_478.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()
                    ((default_delete<tf::Node> *)&local_478,
                     (Node *)local_478.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        }
        pNVar13 = local_3a8.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                  super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        uStack_446 = 0x2d;
        local_458._16_2_ = 0x7472;
        local_458._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
        uStack_445 = 0;
        cVar19 = '\x01';
        if (9 < uVar11) {
          uVar16 = uVar11;
          cVar8 = '\x04';
          do {
            cVar19 = cVar8;
            if (uVar16 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_00121e20;
            }
            if (uVar16 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_00121e20;
            }
            if (uVar16 < 10000) goto LAB_00121e20;
            bVar7 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            cVar8 = cVar19 + '\x04';
          } while (bVar7);
          cVar19 = cVar19 + '\x01';
        }
LAB_00121e20:
        local_438._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_428;
        local_458._0_8_ = pTVar5;
        std::__cxx11::string::_M_construct((ulong)&local_438,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_438._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,
                   (uint)local_438._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi,uVar11);
        p_Var20 = (_func_void *)0xf;
        if ((Topology *)local_458._0_8_ != pTVar5) {
          p_Var20 = (_func_void *)
                    CONCAT44(uStack_444,CONCAT13(uStack_445,CONCAT12(uStack_446,local_458._16_2_)));
        }
        p_Var4 = (_func_void *)
                 ((long)(_func_int ***)local_458._8_8_ +
                 CONCAT44(local_438._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,
                          (uint)local_438._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi));
        if (p_Var20 < p_Var4) {
          uVar21 = (_func_void *)0xf;
          if ((_Any_data *)
              local_438._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != &local_428) {
            uVar21 = local_428._M_unused._0_8_;
          }
          if ((ulong)uVar21 < p_Var4) goto LAB_00121e8e;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_438,0,(char *)0x0,local_458._0_8_);
        }
        else {
LAB_00121e8e:
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      (local_458,
                                       (ulong)local_438._M_state.
                                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr);
        }
        local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_468;
        peVar2 = (element_type *)(plVar12 + 2);
        if ((element_type *)*plVar12 == peVar2) {
          local_468._0_8_ = peVar2->_vptr__State_baseV2;
          local_468._8_8_ = peVar2->_M_result;
        }
        else {
          local_468._0_8_ = peVar2->_vptr__State_baseV2;
          local_478.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar12;
        }
        local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar12[1];
        *plVar12 = (long)peVar2;
        plVar12[1] = 0;
        *(undefined1 *)&peVar2->_vptr__State_baseV2 = 0;
        std::__cxx11::string::_M_assign((string *)&pNVar13->_name);
        local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11 + 1]._node = pNVar13;
        if (local_478.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)local_468) {
          operator_delete(local_478.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_468._0_8_ + 1);
        }
        if ((_Any_data *)
            local_438._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != &local_428) {
          operator_delete(local_438._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(ulong)(local_428._M_unused._M_member_pointer + 1));
        }
        if ((Topology *)local_458._0_8_ != pTVar5) {
          operator_delete((void *)local_458._0_8_,
                          CONCAT44(uStack_444,
                                   CONCAT13(uStack_445,CONCAT12(uStack_446,local_458._16_2_))) + 1);
        }
        uVar11 = uVar11 + 1;
        tf::Task::precede<tf::Task&>
                  (local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11);
      } while (uVar11 < (ulong)(((long)local_2c8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2c8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    uVar21 = local_260._0_8_;
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_478.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_478.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_478.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    (((Node *)local_478.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      **)&(((Node *)local_478.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = &local_3a8;
    *(__index_type *)
     ((long)&(((Node *)local_478.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x06';
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_478.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar21,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_478);
    if ((Node *)local_478.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_478,
                 (Node *)local_478.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var6._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar21)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_468;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_478,"module_of_datapipeline","");
    std::__cxx11::string::_M_assign((string *)&(_Var6._M_head_impl)->_name);
    local_280._M_head_impl = _Var6._M_head_impl;
    if (local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_468) {
      operator_delete(local_478.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_468._0_8_ + 1);
    }
    uVar21 = local_260._0_8_;
    pNVar13 = (Node *)operator_new(0xd8);
    pNVar13->_nstate = 0;
    pNVar13->_estate = (__atomic_base<int>)0x0;
    (pNVar13->_name)._M_dataplus._M_p = (pointer)&(pNVar13->_name).field_2;
    (pNVar13->_name)._M_string_length = 0;
    (pNVar13->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar13->_data = (void *)0x0;
    pNVar13->_topology = (Topology *)0x0;
    pNVar13->_parent = (Node *)0x0;
    pNVar13->_num_successors = 0;
    (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar13->_join_counter;
    *(undefined1 (*) [16])&pNVar13->_join_counter = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x18) = 0;
    plVar12 = (long *)operator_new(0x38);
    *plVar12 = (long)&local_408;
    plVar12[1] = (long)(local_408._M_pod_data + 8);
    plVar12[2] = (long)&local_418;
    plVar12[3] = (long)&local_410;
    plVar12[4] = (long)local_3f8;
    plVar12[5] = (long)&local_3a8;
    plVar12[6] = (long)&local_3d0;
    *(long **)&(pNVar13->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               ._M_u = plVar12;
    *(code **)((long)&(pNVar13->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:744:34)>
         ::_M_invoke;
    *(code **)((long)&(pNVar13->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:744:34)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    pNVar13->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar13->_exception_ptr = (void *)0x0;
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pNVar13;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar21,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_478);
    if ((Node *)local_478.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_478,
                 (Node *)local_478.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var6._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar21)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_478.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_468;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"test","");
    std::__cxx11::string::_M_assign((string *)&(_Var6._M_head_impl)->_name);
    __mutex = &local_168._topology_mutex;
    local_288._M_head_impl = _Var6._M_head_impl;
    if (local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_468) {
      operator_delete(local_478.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_468._0_8_ + 1);
    }
    tf::Task::precede<tf::Task&>((Task *)&local_280,(Task *)&local_288);
    iVar23 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar23 != 0) {
      std::__throw_system_error(iVar23);
    }
    local_168._num_topologies = local_168._num_topologies + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_210._0_8_ == local_210._8_8_) {
      local_410 = (_Invoker_type)0x0;
      LOCK();
      local_418 = (_Manager_type)0x0;
      UNLOCK();
      local_408._M_unused._M_object = (void *)0x0;
      if (local_3f8._8_8_ != local_3f8._0_8_) {
        local_3f8._8_8_ = local_3f8._0_8_;
      }
      local_3d0 = local_3d0 + 1;
      std::promise<void>::promise((promise<void> *)local_458);
      std::promise<void>::set_value((promise<void> *)local_458);
      iVar23 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar23 != 0) {
        std::__throw_system_error(iVar23);
      }
      local_168._num_topologies = local_168._num_topologies - 1;
      if (local_168._num_topologies == 0) {
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::__basic_future<void>::__basic_future(&local_438,(__state_type *)local_458);
      local_478.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_438._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_,
                       (uint)local_438._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      local_478.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_438._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_468 = (undefined1  [16])0x0;
      std::promise<void>::~promise((promise<void> *)local_458);
    }
    else {
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
      p_Var14->_M_use_count = 1;
      p_Var14->_M_weak_count = 1;
      p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00180c98;
      p_Var14[1]._vptr__Sp_counted_base = (_func_int **)local_260;
      std::promise<void>::promise((promise<void> *)&p_Var14[1]._M_use_count);
      p_Var14[3]._M_use_count = 0;
      p_Var14[3]._M_weak_count = 0;
      p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x2;
      *(code **)&p_Var14[4]._M_use_count =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      p_Var14[4]._vptr__Sp_counted_base =
           (_func_int **)
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      p_Var14[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var14[5]._M_use_count = 0;
      p_Var14[5]._M_weak_count = 0;
      p_Var14[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var14[6]._M_use_count = 0;
      p_Var14[6]._M_weak_count = 0;
      pp_Var15 = (_func_int **)operator_new(0x28);
      *pp_Var15 = (_func_int *)&local_408;
      pp_Var15[1] = (_func_int *)&local_418;
      pp_Var15[2] = (_func_int *)&local_410;
      pp_Var15[3] = (_func_int *)local_3f8;
      pp_Var15[4] = (_func_int *)&local_3d0;
      p_Var14[5]._vptr__Sp_counted_base = pp_Var15;
      *(code **)&p_Var14[6]._M_use_count =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:760:33)>
           ::_M_invoke;
      p_Var14[6]._vptr__Sp_counted_base =
           (_func_int **)
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:760:33)>
           ::_M_manager;
      p_Var14[7]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var14[7]._M_use_count = 0;
      p_Var14[8]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_458._0_8_ = (Topology *)(p_Var14 + 1);
      local_458._8_8_ = p_Var14;
      std::__basic_future<void>::__basic_future(&local_438,(__state_type *)&p_Var14[1]._M_use_count)
      ;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_weak_count = p_Var14->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_weak_count = p_Var14->_M_weak_count + 1;
      }
      local_478.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_438._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_,
                       (uint)local_438._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      local_478.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_438._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_468._8_8_ = p_Var14;
      local_468._0_8_ = (Topology *)(p_Var14 + 1);
      iVar23 = pthread_mutex_lock((pthread_mutex_t *)(local_260 + 8));
      if (iVar23 != 0) {
        std::__throw_system_error(iVar23);
      }
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back((deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                 *)(local_200 + 8),(value_type *)local_458);
      if (((long)(local_1e0._8_8_ - local_1f0._8_8_) >> 4) +
          ((long)(local_1d0._8_8_ - local_1c0._0_8_) >> 4) +
          ((((ulong)((long)local_1b0 - local_1d0._0_8_) >> 3) - 1) +
          (ulong)(local_1b0 == (_Map_pointer)0x0)) * 0x20 == 1) {
        tf::Executor::_set_up_topology
                  (&local_168,*(Worker **)(in_FS_OFFSET + -8),(Topology *)local_458._0_8_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)(local_260 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._8_8_);
      }
    }
    std::future<void>::get(&local_478);
    if ((__uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
         )local_468._8_8_ !=
        (__uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
         )0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar3 = (int *)(local_468._8_8_ + 0xc);
        iVar23 = *piVar3;
        *piVar3 = *piVar3 + -1;
        UNLOCK();
      }
      else {
        iVar23 = *(int *)(local_468._8_8_ + 0xc);
        *(int *)(local_468._8_8_ + 0xc) = iVar23 + -1;
      }
      if (iVar23 == 1) {
        (**(code **)(*(long *)local_468._8_8_ + 0x18))();
      }
    }
    if (local_478.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_478.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_2b0.
        super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.
                      super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b0.
                            super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b0.
                            super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,0x80);
    }
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::~vector(&local_2c8);
    if (local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start != (Task *)0x0) {
      operator_delete(local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((void *)local_2f8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_2f8._0_8_,(long)local_2e8 - local_2f8._0_8_);
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::~vector(&local_3a8);
    if ((void *)local_3f8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_3f8._0_8_,local_3e8 - local_3f8._0_8_);
    }
    tf::Taskflow::~Taskflow((Taskflow *)local_260);
    local_408._8_8_ = local_408._8_8_ + 1;
    if (100 < (ulong)local_408._8_8_) {
      if ((void *)local_3c8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_3c8._0_8_,local_3b8 - local_3c8._0_8_);
      }
      tf::Executor::~Executor(&local_168);
      return;
    }
  } while( true );
}

Assistant:

void data_pipeline_3P_SPS(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  // std::vector<std::array<int, 3>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0, j3 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::DataPipeline pl(L,
      tf::make_data_pipe<tf::Pipeflow&, int>(tf::PipeType::SERIAL, [N, &source, &j1, L](tf::Pipeflow& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return 0;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        // mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        // j1++;
        return source[j1++] + 1;
      }),

      tf::make_data_pipe<int, int>(tf::PipeType::PARALLEL, [N, &j2, &mutex, &collection, L](int input, tf::Pipeflow& pf) mutable {
        REQUIRE(j2++ < N);
        //*(pf.output()) = *(pf.input()) + 1;
        {
          std::scoped_lock<std::mutex> lock(mutex);
          // mybuffer[pf.line()][pf.pipe()] = mybuffer[pf.line()][pf.pipe() - 1] + 1;
          REQUIRE(pf.token() % L == pf.line());
          collection.push_back(input);
          return input + 1;
        }
      }),

      tf::make_data_pipe<int, void>(tf::PipeType::SERIAL, [N, &source, &j3, L](int input, tf::Pipeflow& pf) mutable {
        REQUIRE(j3 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j3] + 2 == input);
        j3++;
      })
    );

    auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);
      REQUIRE(j3 == N);
      REQUIRE(collection.size() == N);

      std::sort(collection.begin(), collection.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);

    }).name("test");

    datapipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = j3 = 0;
      collection.clear();
      // for(size_t i = 0; i < mybuffer.size(); ++i){
      //   for(size_t j = 0; j < mybuffer[0].size(); ++j){
      //     mybuffer[i][j] = 0;
      //   }
      // }

      cnt++;
    }).get();
  }
}